

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qibustypes.cpp
# Opt level: O2

void __thiscall QIBusEngineDesc::serializeTo(QIBusEngineDesc *this,QDBusArgument *argument)

{
  QDBusArgument::beginStructure();
  QIBusSerializable::serializeTo(&this->super_QIBusSerializable,argument);
  QDBusArgument::operator<<(argument,(QString *)&this->engine_name);
  QDBusArgument::operator<<(argument,(QString *)&this->longname);
  QDBusArgument::operator<<(argument,(QString *)&this->description);
  QDBusArgument::operator<<(argument,(QString *)&this->language);
  QDBusArgument::operator<<(argument,(QString *)&this->license);
  QDBusArgument::operator<<(argument,(QString *)&this->author);
  QDBusArgument::operator<<(argument,(QString *)&this->icon);
  QDBusArgument::operator<<(argument,(QString *)&this->layout);
  QDBusArgument::operator<<(argument,this->rank);
  QDBusArgument::operator<<(argument,(QString *)&this->hotkeys);
  QDBusArgument::operator<<(argument,(QString *)&this->symbol);
  QDBusArgument::operator<<(argument,(QString *)&this->setup);
  QDBusArgument::operator<<(argument,(QString *)&this->layout_variant);
  QDBusArgument::operator<<(argument,(QString *)&this->layout_option);
  QDBusArgument::operator<<(argument,(QString *)&this->version);
  QDBusArgument::operator<<(argument,(QString *)&this->textdomain);
  QDBusArgument::operator<<(argument,(QString *)&this->iconpropkey);
  QDBusArgument::endStructure();
  return;
}

Assistant:

void QIBusEngineDesc::serializeTo(QDBusArgument &argument) const
{
    argument.beginStructure();

    QIBusSerializable::serializeTo(argument);

    argument << engine_name;
    argument << longname;
    argument << description;
    argument << language;
    argument << license;
    argument << author;
    argument << icon;
    argument << layout;
    argument << rank;
    argument << hotkeys;
    argument << symbol;
    argument << setup;
    argument << layout_variant;
    argument << layout_option;
    argument << version;
    argument << textdomain;
    argument << iconpropkey;

    argument.endStructure();
}